

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

void Wlc_NtkPrintNtk(Wlc_Ntk_t *p)

{
  Wlc_Obj_t *pWVar1;
  int iObj;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  Wlc_Ntk_t *pWVar7;
  long lVar8;
  
  pWVar7 = p;
  Abc_Print((int)p,"PIs:");
  uVar6 = (uint)pWVar7;
  if (0 < (p->vPis).nSize) {
    lVar8 = 0;
    do {
      iVar2 = (p->vPis).pArray[lVar8];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_00890ef7;
      pWVar7 = p;
      pcVar3 = Wlc_ObjName(p,iVar2);
      uVar6 = (uint)pWVar7;
      Abc_Print(uVar6," %s",pcVar3);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vPis).nSize);
  }
  Abc_Print(uVar6,"\n\n");
  Abc_Print(uVar6,"POs:");
  if (0 < (p->vPos).nSize) {
    lVar8 = 0;
    do {
      iVar2 = (p->vPos).pArray[lVar8];
      if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_00890ef7;
      pWVar7 = p;
      pcVar3 = Wlc_ObjName(p,iVar2);
      uVar6 = (uint)pWVar7;
      Abc_Print(uVar6," %s",pcVar3);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vPos).nSize);
  }
  Abc_Print(uVar6,"\n\n");
  Abc_Print(uVar6,"FO(Fi)s:");
  iVar2 = (p->vCis).nSize;
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      iObj = (p->vCis).pArray[lVar8];
      lVar5 = (long)iObj;
      if ((lVar5 < 1) || (p->nObjsAlloc <= iObj)) goto LAB_00890ef7;
      uVar6 = *(ushort *)(p->pObjs + lVar5) & 0x3f;
      if ((short)uVar6 != 1) {
        pWVar1 = p->pObjs + lVar5;
        pcVar3 = Wlc_ObjName(p,iObj);
        if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) !=
            (undefined1  [24])0x3) {
          __assert_fail("pObj->Type == WLC_OBJ_FO",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
        }
        uVar6 = ((pWVar1->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
        if (((int)uVar6 < 0) || ((p->vCos).nSize <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = (p->vCos).pArray[uVar6];
        if ((iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_00890ef7;
        pWVar7 = p;
        pcVar4 = Wlc_ObjName(p,iVar2);
        uVar6 = (uint)pWVar7;
        Abc_Print(uVar6," %s(%s)",pcVar3,pcVar4);
        iVar2 = (p->vCis).nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar2);
  }
  Abc_Print(uVar6,"\n\n");
  Abc_Print(uVar6,"Objs:\n");
  iVar2 = p->iObj;
  if (1 < iVar2) {
    lVar8 = 1;
    lVar5 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar8) {
LAB_00890ef7:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((*(ushort *)(&p->pObjs->field_0x0 + lVar5) & 0x3d) != 1) {
        Wlc_NtkPrintNode(p,(Wlc_Obj_t *)(&p->pObjs->field_0x0 + lVar5));
        iVar2 = p->iObj;
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar8 < iVar2);
  }
  return;
}

Assistant:

void Wlc_NtkPrintNtk( Wlc_Ntk_t * p )
{
    int i;
    Wlc_Obj_t * pObj;

    Abc_Print( 1, "PIs:");
    Wlc_NtkForEachPi( p, pObj, i )
        Abc_Print( 1, " %s", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "POs:");
    Wlc_NtkForEachPo( p, pObj, i )
        Abc_Print( 1, " %s", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "FO(Fi)s:");
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !Wlc_ObjIsPi( pObj ) )
            Abc_Print( 1, " %s(%s)", Wlc_ObjName(p, Wlc_ObjId(p, pObj)), Wlc_ObjName(p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj))) );
    Abc_Print( 1, "\n\n");

    Abc_Print( 1, "Objs:\n");
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( !Wlc_ObjIsCi(pObj) )
           Wlc_NtkPrintNode( p, pObj ) ;
    }
}